

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake_test.c
# Opt level: O0

err_t fileMsgRead(size_t *read,void *buf,size_t count,void *file)

{
  ulong *in_RCX;
  long in_RDX;
  long *in_RDI;
  file_msg_st *f;
  void *in_stack_ffffffffffffffc8;
  err_t local_4;
  
  if (*in_RCX < 4) {
    if (_msgs[*in_RCX].valid == 0) {
      local_4 = 0xca;
    }
    else if (_msgs[*in_RCX].len < in_RDX + in_RCX[1]) {
      *in_RDI = _msgs[*in_RCX].len - in_RCX[1];
      memCopy(in_RCX,in_stack_ffffffffffffffc8,0x10863e);
      *in_RCX = *in_RCX + 1;
      in_RCX[1] = 0;
      local_4 = 0xffffffff;
    }
    else {
      *in_RDI = in_RDX;
      memCopy(in_RCX,in_stack_ffffffffffffffc8,0x1086a1);
      in_RCX[1] = in_RDX + in_RCX[1];
      if (in_RCX[1] == _msgs[*in_RCX].len) {
        *in_RCX = *in_RCX + 1;
        in_RCX[1] = 0;
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0xcf;
  }
  return local_4;
}

Assistant:

static err_t fileMsgRead(size_t* read, void* buf, size_t count, void* file)
{
	file_msg_st* f;
	// pre
	ASSERT(memIsValid(file, sizeof(file_msg_st)));
	ASSERT(memIsValid(buf, count));
	ASSERT(memIsValid(read, sizeof(size_t)));
	// найти сообщение
	f = (file_msg_st*)file;
	if (f->i >= 4)
		return ERR_FILE_READ;
	if (!_msgs[f->i].valid)
		return ERR_FILE_NOT_FOUND;
	// прочитать частично?
	ASSERT(f->offset <= _msgs[f->i].len);
	if (count + f->offset > _msgs[f->i].len)
	{
		memCopy(buf, _msgs[f->i].buf + f->offset,
			*read = _msgs[f->i].len - f->offset);
		++f->i, f->offset = 0;
		return ERR_MAX;
	}
	// прочитать полностью
	memCopy(buf, _msgs[f->i].buf + f->offset, *read = count);
	f->offset += count;
	// конец сообщения?
	if (f->offset == _msgs[f->i].len)
		++f->i, f->offset = 0;
	// все нормально
	return ERR_OK;
}